

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QAV.h
# Opt level: O0

string * __thiscall
QAV<QBGPlanner_TreeIncPruneBnB>::SoftPrintBrief_abi_cxx11_(QAV<QBGPlanner_TreeIncPruneBnB> *this)

{
  long in_RSI;
  string *in_RDI;
  string *__rhs;
  string *__lhs;
  string local_30 [48];
  
  __lhs = local_30;
  __rhs = in_RDI;
  (**(code **)(**(long **)(in_RSI + 8) + 0x30))();
  std::operator+((char *)__lhs,__rhs);
  std::__cxx11::string::~string(local_30);
  return in_RDI;
}

Assistant:

std::string SoftPrintBrief() const { return("QAV" + _m_p->SoftPrintBrief()); }